

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O3

string * __thiscall
cfd::core::ScriptOperator::ToCodeString_abi_cxx11_
          (string *__return_storage_ptr__,ScriptOperator *this)

{
  string *psVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  uint uVar7;
  size_type *psVar8;
  char *pcVar9;
  char *pcVar10;
  uint __val;
  uint __len;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  psVar1 = &this->text_data_;
  iVar5 = ::std::__cxx11::string::compare((char *)psVar1);
  if (iVar5 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar10 = "OP_0";
    pcVar9 = "";
  }
  else {
    iVar5 = ::std::__cxx11::string::compare((char *)psVar1);
    if (iVar5 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "OP_1NEGATE";
      pcVar9 = "";
    }
    else {
      iVar5 = ::std::__cxx11::string::compare((char *)psVar1);
      if (iVar5 != 0) {
        if (0xe < this->data_type_ - kOp_2) {
          ToString_abi_cxx11_(__return_storage_ptr__,this);
          return __return_storage_ptr__;
        }
        __val = this->data_type_ - kOpReserved;
        __len = 1;
        if (9 < __val) {
          uVar7 = __val;
          uVar4 = 4;
          do {
            __len = uVar4;
            if (uVar7 < 100) {
              __len = __len - 2;
              goto LAB_00306c98;
            }
            if (uVar7 < 1000) {
              __len = __len - 1;
              goto LAB_00306c98;
            }
            if (uVar7 < 10000) goto LAB_00306c98;
            bVar2 = 99999 < uVar7;
            uVar7 = uVar7 / 10000;
            uVar4 = __len + 4;
          } while (bVar2);
          __len = __len + 1;
        }
LAB_00306c98:
        local_50[0] = local_40;
        ::std::__cxx11::string::_M_construct
                  ((ulong)local_50,(char)__len - (char)((int)__val >> 0x1f));
        ::std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + (__val >> 0x1f),__len,__val)
        ;
        plVar6 = (long *)::std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x5d456a);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar8 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar8) {
          lVar3 = plVar6[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
        }
        __return_storage_ptr__->_M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_50[0] == local_40) {
          return __return_storage_ptr__;
        }
        operator_delete(local_50[0]);
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "OP_1";
      pcVar9 = "";
    }
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar10,pcVar9)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string ScriptOperator::ToCodeString() const {
  if (text_data_ == "0") {
    return "OP_0";
  } else if (text_data_ == "-1") {
    return "OP_1NEGATE";
  } else if (text_data_ == "1") {
    return "OP_1";
  } else if (
      (data_type_ >= ScriptType::kOp_2) &&
      (data_type_ <= ScriptType::kOp_16)) {
    int num = static_cast<int>(data_type_);
    num -= static_cast<int>(ScriptType::kOp_1);
    num += 1;
    return "OP_" + std::to_string(num);
  }
  return ToString();
}